

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3SnippetFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  char **ppIter;
  byte bVar1;
  sqlite3_stmt *pStmt;
  sqlite3_module *pTokenizer;
  sqlite3_tokenizer_module *psVar2;
  bool bVar3;
  bool bVar4;
  sqlite3_tokenizer_module *psVar5;
  Fts3Cursor *pFVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  undefined4 extraout_var;
  long *plVar12;
  void *pvVar13;
  ulong uVar14;
  uchar *puVar15;
  Mem *pMVar16;
  void *pvVar17;
  uint uVar18;
  sqlite3_vtab *psVar19;
  sqlite3_vtab *psVar20;
  ulong uVar21;
  void *pvVar22;
  char *pCsr_1;
  byte *p;
  char *z;
  uchar *puVar23;
  code *xDel;
  sqlite3_tokenizer_cursor *psVar24;
  uint uVar25;
  void *pvVar26;
  ulong uVar27;
  long lVar28;
  int iBegin;
  int iCurrent;
  int iCurrent_1;
  sqlite3_tokenizer_cursor *pC_1;
  StrBuffer res;
  char *ZDUMMY_1;
  sqlite3_tokenizer_cursor *pC;
  int DUMMY1;
  int DUMMY2;
  int DUMMY1_1;
  Fts3Cursor *pCsr;
  char *ZDUMMY;
  int local_200;
  int local_1fc;
  uchar *local_1f8;
  uint local_1ec;
  int local_1e8;
  int local_1e4;
  sqlite3_tokenizer_module *local_1e0;
  uint local_1d8;
  int local_1d4;
  ulong local_1d0;
  Fts3Cursor *local_1c8;
  void *local_1c0;
  Fts3Cursor *local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  void *pvStack_1a0;
  undefined8 local_198;
  sqlite3_context *local_190;
  ulong local_188;
  void *local_180;
  sqlite3_vtab *local_178;
  uint local_16c;
  StrBuffer local_168;
  Fts3Cursor *local_158;
  ulong uStack_150;
  uchar *local_148;
  i64 local_140;
  ulong local_138;
  void *local_130;
  uchar *local_128;
  sqlite3_tokenizer_cursor *local_120;
  sqlite3_vtab *local_118;
  sqlite3_vtab *local_110;
  void *local_108;
  undefined8 local_100;
  uint local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  uint *local_e0;
  i64 local_d8;
  char *local_d0;
  char *local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  Fts3Cursor *local_a8;
  char *local_a0;
  uint local_98 [2];
  ulong auStack_90 [12];
  
  if (6 < nVal) {
    pContext->isError = 1;
    sqlite3VdbeMemSetStr
              (pContext->pOut,"wrong number of arguments to function snippet()",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  iVar8 = fts3FunctionArg(pContext,"snippet",*apVal,&local_a8);
  if (iVar8 != 0) {
    return;
  }
  local_140 = 0xf;
  local_d8 = 0xffffffff;
  local_148 = "<b>...</b>";
  local_c8 = "</b>";
  local_190 = pContext;
  switch(nVal) {
  case 6:
    local_140 = sqlite3VdbeIntValue(apVal[5]);
  case 5:
    local_d8 = sqlite3VdbeIntValue(apVal[4]);
  case 4:
    local_148 = (uchar *)sqlite3ValueText(apVal[3],'\x01');
  case 3:
    local_c8 = (char *)sqlite3ValueText(apVal[2],'\x01');
  case 2:
    local_d0 = (char *)sqlite3ValueText(apVal[1],'\x01');
    break;
  default:
    local_d0 = "<b>";
  }
  if ((local_c8 == (char *)0x0 || local_148 == (uchar *)0x0) || local_d0 == (char *)0x0) {
    sqlite3_result_error_nomem(local_190);
    return;
  }
  if ((int)local_140 == 0) {
    setResultStrOrError(local_190,"",-1,'\x01',(_func_void_void_ptr *)0x0);
    return;
  }
  iVar8 = fts3CursorSeek(local_190,local_a8);
  if (iVar8 != 0) {
    return;
  }
  psVar19 = (local_a8->base).pVtab;
  local_168.z = (char *)0x0;
  local_168.n = 0;
  local_168.nAlloc = 0;
  if (local_a8->pExpr != (Fts3Expr *)0x0) {
    iVar8 = -0x40;
    if (-0x40 < (int)local_140) {
      iVar8 = (int)local_140;
    }
    iVar10 = 0x40;
    if (iVar8 < 0x40) {
      iVar10 = iVar8;
    }
    local_f4 = -iVar10;
    local_c0 = (ulong)(iVar10 - 1);
    uVar27 = 0;
    local_188 = 1;
    local_1c8 = local_a8;
    local_118 = psVar19;
    do {
      local_1d0 = (ulong)local_f4;
      if (-1 < (int)local_140) {
        local_1d0 = (long)((int)local_c0 + (int)local_188) / (long)(int)local_188 & 0xffffffff;
      }
      uVar14 = 0;
      puVar23 = (uchar *)0x0;
      puVar15 = (uchar *)0x0;
      do {
        local_e0 = local_98 + uVar14 * 6;
        local_e0[0] = 0;
        local_e0[1] = 0;
        auStack_90[uVar14 * 3] = 0;
        auStack_90[uVar14 * 3 + 1] = 0;
        local_b8 = uVar14;
        if (0 < *(int *)&psVar19[2].pModule) {
          local_16c = 0xffffffff;
          iVar8 = 0;
          local_1f8 = puVar23;
          do {
            local_1e0 = (sqlite3_tokenizer_module *)CONCAT44(local_1e0._4_4_,iVar8);
            cVar7 = '\n';
            if ((int)local_d8 < 0 || iVar8 == (int)local_d8) {
              local_1a8 = 0;
              pvStack_1a0 = (void *)0x0;
              local_1b8 = (Fts3Cursor *)0x0;
              uStack_1b0 = 0;
              local_198 = 0;
              uStack_150 = 0;
              local_100._0_4_ = 0;
              local_158 = local_a8;
              uVar9 = fts3ExprIterate2(local_a8->pExpr,(int *)&local_100,fts3ExprLoadDoclistsCb,
                                       &local_158);
              if (uVar9 == 0) {
                iVar8 = (int)uStack_150;
                uVar27 = uStack_150 & 0xffffffff;
                lVar11 = (long)(int)uStack_150;
                iVar10 = sqlite3_initialize();
                if (iVar10 == 0) {
                  pvStack_1a0 = sqlite3Malloc(lVar11 * 0x30);
                }
                else {
                  pvStack_1a0 = (void *)0x0;
                }
                if (pvStack_1a0 == (void *)0x0) {
                  uVar27 = 7;
                  uVar18 = 0;
                  local_1ec = 0;
                  local_130 = (void *)0x0;
                  local_138 = 0;
                  uVar25 = 0;
                  psVar19 = local_118;
                }
                else {
                  memset(pvStack_1a0,0,lVar11 * 0x30);
                  local_1b8 = local_1c8;
                  uStack_1b0 = CONCAT44((int)local_1d0,(int)local_1e0);
                  local_1a8 = CONCAT44(local_1a8._4_4_,iVar8);
                  local_198 = CONCAT44(local_198._4_4_,0xffffffff);
                  local_158 = (Fts3Cursor *)((ulong)local_158 & 0xffffffff00000000);
                  iVar10 = fts3ExprIterate2(local_1c8->pExpr,(int *)&local_158,
                                            fts3SnippetFindPositions,&local_1b8);
                  local_b0 = CONCAT44(extraout_var,iVar10);
                  if (iVar10 == 0) {
                    if (0 < iVar8) {
                      plVar12 = (long *)((long)pvStack_1a0 + 0x18);
                      uVar14 = 0;
                      do {
                        uVar21 = 1L << ((byte)uVar14 & 0x3f);
                        if (*plVar12 == 0) {
                          uVar21 = 0;
                        }
                        puVar15 = (uchar *)((ulong)puVar15 | uVar21);
                        uVar14 = uVar14 + 1;
                        plVar12 = plVar12 + 6;
                      } while (uVar27 != uVar14);
                    }
                    pvVar17 = (void *)0x0;
                    pvVar13 = (void *)0x0;
                    uVar27 = 0;
                    local_128 = puVar15;
                    uVar9 = 0xffffffff;
                    do {
                      local_1d8 = uVar9;
                      local_1ec = (uint)pvVar17;
                      local_138 = uVar27;
                      local_130 = pvVar13;
                      do {
                        if ((int)local_198 < 0) {
                          local_198 = (ulong)local_198._4_4_ << 0x20;
                          if (0 < (int)local_1a8) {
                            lVar11 = 0x10;
                            lVar28 = 0;
                            do {
                              fts3SnippetAdvance((char **)((long)pvStack_1a0 + lVar11 + 8),
                                                 (int *)((long)pvStack_1a0 + lVar11),
                                                 uStack_1b0._4_4_);
                              lVar28 = lVar28 + 1;
                              lVar11 = lVar11 + 0x30;
                            } while (lVar28 < (int)local_1a8);
                          }
                        }
                        else {
                          if ((long)(int)local_1a8 < 1) {
                            iVar8 = 0x7fffffff;
                          }
                          else {
                            iVar8 = 0x7fffffff;
                            lVar11 = 0;
                            do {
                              if ((*(long *)((long)pvStack_1a0 + lVar11 + 0x18) != 0) &&
                                 (iVar10 = *(int *)((long)pvStack_1a0 + lVar11 + 0x10),
                                 iVar10 < iVar8)) {
                                iVar8 = iVar10;
                              }
                              lVar11 = lVar11 + 0x30;
                            } while ((long)(int)local_1a8 * 0x30 != lVar11);
                          }
                          if (iVar8 == 0x7fffffff) {
                            puVar15 = local_128;
                            uVar18 = (uint)local_1e0;
                            uVar25 = local_1d8;
                            goto LAB_001c5b85;
                          }
                          iVar10 = (iVar8 - uStack_1b0._4_4_) + 1;
                          local_198 = CONCAT44(local_198._4_4_,iVar10);
                          if (0 < (int)local_1a8) {
                            lVar28 = 0x28;
                            lVar11 = 0;
                            do {
                              pvVar17 = pvStack_1a0;
                              ppIter = (char **)(lVar28 + (long)pvStack_1a0);
                              fts3SnippetAdvance((char **)((long)pvStack_1a0 + lVar28 + -0x10),
                                                 (int *)((long)pvStack_1a0 + lVar28 + -0x18),
                                                 iVar8 + 1);
                              fts3SnippetAdvance(ppIter,(int *)((long)pvVar17 + lVar28 + -8),iVar10)
                              ;
                              lVar11 = lVar11 + 1;
                              lVar28 = lVar28 + 0x30;
                            } while (lVar11 < (int)local_1a8);
                          }
                        }
                        pvVar17 = (void *)(local_198 & 0xffffffff);
                        local_110 = (sqlite3_vtab *)(long)(int)local_1a8;
                        if ((long)local_110 < 1) {
                          uVar27 = 0;
                          pvVar13 = (void *)0x0;
                          uVar9 = 0;
                        }
                        else {
                          iVar8 = uStack_1b0._4_4_ + (int)local_198;
                          psVar19 = (sqlite3_vtab *)0x0;
                          uVar9 = 0;
                          pvVar13 = (void *)0x0;
                          uVar27 = 0;
                          local_180 = pvStack_1a0;
                          pvVar22 = pvStack_1a0;
                          puVar23 = local_1f8;
                          local_108 = pvVar17;
                          do {
                            p = *(byte **)((long)pvVar22 + (long)psVar19 * 0x30 + 0x28);
                            psVar20 = psVar19;
                            if (p != (byte *)0x0) {
                              psVar24 = (sqlite3_tokenizer_cursor *)
                                        ((long)psVar19 * 0x30 + (long)pvVar22);
                              iVar10 = *(int *)&psVar24[4].pTokenizer;
                              local_1c0 = (void *)((ulong)pvVar13 | 1L << ((ulong)psVar19 & 0x3f));
                              pvVar26 = local_1c0;
                              local_178 = psVar19;
                              local_120 = psVar24;
                              do {
                                psVar20 = local_178;
                                pvVar22 = local_180;
                                if ((iVar10 < (int)pvVar17) || (iVar8 <= iVar10)) break;
                                uVar18 = uVar9 + 1;
                                uVar9 = uVar9 + 1000;
                                if ((((ulong)pvVar13 | (ulong)puVar23) &
                                    1L << ((byte)psVar19 & 0x3f)) != 0) {
                                  uVar9 = uVar18;
                                }
                                if (0 < (long)*(int *)&psVar24->pTokenizer) {
                                  lVar11 = 0;
                                  do {
                                    uVar27 = uVar27 | (ulong)(1L << ((char)iVar10 - (char)pvVar17 &
                                                                    0x3fU)) >> ((byte)lVar11 & 0x3f)
                                    ;
                                    lVar11 = lVar11 + 1;
                                  } while (*(int *)&psVar24->pTokenizer != lVar11);
                                }
                                bVar1 = *p;
                                pvVar13 = pvVar26;
                                if (1 < bVar1) {
                                  if ((char)*p < '\0') {
                                    uVar18 = sqlite3Fts3GetVarint32((char *)p,(int *)&local_158);
                                    uVar14 = (ulong)uVar18;
                                    puVar23 = local_1f8;
                                    pvVar17 = local_108;
                                    psVar24 = local_120;
                                    pvVar13 = local_1c0;
                                  }
                                  else {
                                    local_158 = (Fts3Cursor *)
                                                CONCAT44(local_158._4_4_,(int)(char)*p);
                                    uVar14 = 1;
                                  }
                                  p = p + uVar14;
                                  iVar10 = iVar10 + (int)local_158 + -2;
                                }
                                psVar20 = local_178;
                                pvVar22 = local_180;
                                pvVar26 = pvVar13;
                              } while (1 < bVar1);
                            }
                            psVar19 = (sqlite3_vtab *)((long)&psVar20->pModule + 1);
                          } while (psVar19 != local_110);
                        }
                      } while ((int)uVar9 <= (int)local_1d8);
                    } while( true );
                  }
                  local_1ec = 0;
                  local_130 = (void *)0x0;
                  local_138 = 0;
                  uVar18 = 0;
                  uVar25 = 0;
LAB_001c5b85:
                  sqlite3_free(pvStack_1a0);
                  psVar19 = local_118;
                  uVar27 = local_b0;
                }
              }
              else {
                uVar18 = 0;
                local_1ec = 0;
                local_130 = (void *)0x0;
                local_138 = 0;
                uVar25 = 0;
                uVar27 = (ulong)uVar9;
              }
              cVar7 = '\v';
              puVar23 = local_1f8;
              local_a8 = local_1c8;
              if ((int)uVar27 != 0) goto LAB_001c5bb2;
              uVar27 = 0;
              if ((int)local_16c < (int)uVar25) {
                *local_e0 = uVar18;
                local_e0[1] = local_1ec;
                *(void **)(local_e0 + 2) = local_130;
                *(ulong *)(local_e0 + 4) = local_138;
                local_16c = uVar25;
              }
              cVar7 = '\0';
            }
            else {
LAB_001c5bb2:
            }
            if ((cVar7 != '\n') && (cVar7 != '\0')) goto LAB_001c5c29;
            iVar8 = (uint)local_1e0 + 1;
          } while (iVar8 < *(int *)&psVar19[2].pModule);
        }
        puVar23 = (uchar *)((ulong)puVar23 | *(ulong *)(local_e0 + 2));
        cVar7 = '\0';
LAB_001c5c29:
        iVar8 = (int)uVar27;
        if (cVar7 != '\0') goto LAB_001c5c5f;
        uVar14 = local_b8 + 1;
      } while (uVar14 != local_188);
      cVar7 = (local_188 == 4 || puVar15 == puVar23) * '\x02';
LAB_001c5c5f:
      if (cVar7 != '\0') goto LAB_001c5cc1;
      local_188 = local_188 + 1;
    } while( true );
  }
  z = "";
  iVar8 = 0;
  xDel = (_func_void_void_ptr *)0x0;
LAB_001c61d3:
  setResultStrOrError(local_190,z,iVar8,'\x01',xDel);
  return;
LAB_001c5cc1:
  if (cVar7 != '\v') {
    if (cVar7 != '\x02') {
      return;
    }
    if (iVar8 == 0) {
      local_180 = (void *)(ulong)((int)local_188 - 1);
      local_108 = (void *)(local_188 & 0xffffffff);
      local_1d8 = (int)local_1d0 - 1;
      pvVar17 = (void *)0x0;
      do {
        pFVar6 = local_1c8;
        psVar19 = (local_1c8->base).pVtab;
        local_1e8 = 0;
        puVar23 = (uchar *)(ulong)local_98[(long)pvVar17 * 6 + 1];
        uVar27 = auStack_90[(long)pvVar17 * 3 + 1];
        iVar8 = local_98[(long)pvVar17 * 6] + 1;
        local_1c0 = pvVar17;
        puVar15 = sqlite3_column_text(local_1c8->pStmt,iVar8);
        pStmt = pFVar6->pStmt;
        if (puVar15 == (uchar *)0x0) {
          pMVar16 = columnMem(pStmt,iVar8);
          uVar9._0_2_ = pMVar16->flags;
          uVar9._2_1_ = pMVar16->enc;
          uVar9._3_1_ = pMVar16->eSubtype;
          columnMallocFailure(pStmt);
          iVar8 = 0;
          if ((0xaaaaaaaaU >> (uVar9 & 0x1f) & 1) == 0) {
            iVar8 = 7;
          }
        }
        else {
          iVar10 = sqlite3_column_bytes(pStmt,iVar8);
          pTokenizer = psVar19[3].pModule;
          psVar2 = *(sqlite3_tokenizer_module **)&pTokenizer->iVersion;
          iVar8 = sqlite3Fts3OpenTokenizer
                            ((sqlite3_tokenizer *)pTokenizer,pFVar6->iLangid,(char *)puVar15,iVar10,
                             (sqlite3_tokenizer_cursor **)&local_100);
          if (iVar8 == 0) {
            local_178 = (sqlite3_vtab *)CONCAT44(local_178._4_4_,iVar10);
            bVar4 = false;
            local_120 = (sqlite3_tokenizer_cursor *)CONCAT44(local_100._4_4_,(int)local_100);
            local_200 = 0;
            iVar8 = 0;
            pvVar17 = local_1c0;
            local_1f8 = puVar15;
            local_110 = psVar19;
            do {
              if (iVar8 != 0) break;
              local_f0 = -1;
              local_1fc = 0;
              local_1d4 = 0;
              iVar8 = (*psVar2->xNext)(local_120,&local_a0,&local_f0,&local_1fc,&local_1d4,
                                       &local_1e8);
              bVar3 = true;
              if (iVar8 == 0) {
                iVar8 = 0;
                if ((int)puVar23 <= local_1e8) {
                  iVar8 = 0;
                  if (!bVar4) {
                    iVar8 = 0;
                    if (uVar27 != 0) {
                      uVar14 = 0;
                      iVar8 = 1;
                      do {
                        iVar10 = iVar8;
                        uVar21 = uVar14 & 0x3f;
                        uVar14 = uVar14 + 1;
                        iVar8 = iVar10 + 1;
                        uVar9 = local_1d8;
                      } while ((uVar27 >> uVar21 & 1) == 0);
                      do {
                        uVar14 = (ulong)uVar9;
                        iVar10 = iVar10 + -1;
                        uVar9 = uVar9 - 1;
                      } while ((uVar27 >> (uVar14 & 0x3f) & 1) == 0);
                      if (iVar10 < 2) {
                        iVar8 = 0;
                      }
                      else {
                        local_1e4 = 0;
                        local_1e0 = *(sqlite3_tokenizer_module **)&(local_110[3].pModule)->iVersion;
                        iVar8 = sqlite3Fts3OpenTokenizer
                                          ((sqlite3_tokenizer *)local_110[3].pModule,
                                           local_1c8->iLangid,(char *)(local_1f8 + local_1fc),
                                           (int)local_178 - local_1fc,
                                           (sqlite3_tokenizer_cursor **)&local_1b8);
                        pFVar6 = local_1b8;
                        psVar5 = local_1e0;
                        if (iVar8 == 0) {
                          iVar10 = iVar10 / 2 + (int)local_1d0;
                          iVar8 = 0;
                          local_128 = puVar23;
                          do {
                            if (iVar10 <= local_1e4) break;
                            local_e4 = 0;
                            local_e8 = 0;
                            local_ec = 0;
                            iVar8 = (*psVar5->xNext)((sqlite3_tokenizer_cursor *)pFVar6,
                                                     (char **)&local_158,&local_e4,&local_e8,
                                                     &local_ec,&local_1e4);
                          } while (iVar8 == 0);
                          (*psVar5->xClose)((sqlite3_tokenizer_cursor *)pFVar6);
                          puVar23 = local_128;
                          pvVar17 = local_1c0;
                          if ((iVar8 == 0x65) || (iVar8 == 0)) {
                            iVar10 = ((uint)(iVar8 == 0x65) - (int)local_1d0) + local_1e4;
                            iVar8 = 0;
                            if (0 < iVar10) {
                              uVar27 = uVar27 >> ((byte)iVar10 & 0x3f);
                              puVar23 = (uchar *)(ulong)(uint)((int)local_128 + iVar10);
                            }
                          }
                        }
                      }
                    }
                    if (iVar8 == 0) {
                      if ((pvVar17 == (void *)0x0) && ((int)puVar23 < 1)) {
                        puVar15 = local_1f8;
                        iVar8 = local_1fc;
                        if (local_1fc == 0) {
                          iVar8 = 0;
                          goto LAB_001c5f9f;
                        }
                      }
                      else {
                        puVar15 = local_148;
                        iVar8 = -1;
                      }
                      iVar8 = fts3StringAppend(&local_168,(char *)puVar15,iVar8);
                    }
LAB_001c5f9f:
                    bVar4 = true;
                    if ((iVar8 != 0) || (local_1e8 < (int)puVar23)) goto LAB_001c606f;
                  }
                  if ((int)local_1d0 + (int)puVar23 <= local_1e8) {
                    bVar4 = true;
                    puVar15 = local_148;
                    if (pvVar17 == local_180) goto LAB_001c5e2a;
                    goto LAB_001c6072;
                  }
                  cVar7 = (char)local_1e8;
                  if ((int)puVar23 < local_1e8) {
                    iVar8 = fts3StringAppend(&local_168,(char *)(local_1f8 + local_200),
                                             local_1fc - local_200);
                  }
                  uVar14 = 1L << (cVar7 - (char)puVar23 & 0x3fU) & uVar27;
                  if ((iVar8 == 0) && (uVar14 != 0)) {
                    iVar8 = fts3StringAppend(&local_168,local_d0,-1);
                  }
                  if (iVar8 == 0) {
                    iVar8 = fts3StringAppend(&local_168,(char *)(local_1f8 + local_1fc),
                                             local_1d4 - local_1fc);
                  }
                  if ((iVar8 == 0) && (uVar14 != 0)) {
                    iVar8 = fts3StringAppend(&local_168,local_c8,-1);
                  }
                  bVar4 = true;
                  local_200 = local_1d4;
                }
LAB_001c606f:
                bVar3 = false;
              }
              else if (iVar8 == 0x65) {
                puVar15 = local_1f8 + local_200;
LAB_001c5e2a:
                iVar8 = fts3StringAppend(&local_168,(char *)puVar15,-1);
              }
LAB_001c6072:
            } while (!bVar3);
            (*psVar2->xClose)(local_120);
          }
        }
        pvVar17 = (void *)((long)local_1c0 + 1);
      } while ((pvVar17 < local_108) && (iVar8 == 0));
    }
  }
  psVar19 = local_118;
  sqlite3_blob_close((sqlite3_blob *)local_118[0x13].zErrMsg);
  psVar19[0x13].zErrMsg = (char *)0x0;
  if (iVar8 != 0) {
    sqlite3_result_error_code(local_190,iVar8);
    sqlite3_free(local_168.z);
    return;
  }
  xDel = sqlite3_free;
  iVar8 = -1;
  z = local_168.z;
  goto LAB_001c61d3;
}

Assistant:

static void fts3SnippetFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of apVal[] array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */
  const char *zStart = "<b>";
  const char *zEnd = "</b>";
  const char *zEllipsis = "<b>...</b>";
  int iCol = -1;
  int nToken = 15;                /* Default number of tokens in snippet */

  /* There must be at least one argument passed to this function (otherwise
  ** the non-overloaded version would have been called instead of this one).
  */
  assert( nVal>=1 );

  if( nVal>6 ){
    sqlite3_result_error(pContext, 
        "wrong number of arguments to function snippet()", -1);
    return;
  }
  if( fts3FunctionArg(pContext, "snippet", apVal[0], &pCsr) ) return;

  switch( nVal ){
    case 6: nToken = sqlite3_value_int(apVal[5]);
    case 5: iCol = sqlite3_value_int(apVal[4]);
    case 4: zEllipsis = (const char*)sqlite3_value_text(apVal[3]);
    case 3: zEnd = (const char*)sqlite3_value_text(apVal[2]);
    case 2: zStart = (const char*)sqlite3_value_text(apVal[1]);
  }
  if( !zEllipsis || !zEnd || !zStart ){
    sqlite3_result_error_nomem(pContext);
  }else if( nToken==0 ){
    sqlite3_result_text(pContext, "", -1, SQLITE_STATIC);
  }else if( SQLITE_OK==fts3CursorSeek(pContext, pCsr) ){
    sqlite3Fts3Snippet(pContext, pCsr, zStart, zEnd, zEllipsis, iCol, nToken);
  }
}